

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NtkSortCubes(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *vCubes;
  void **ppvVar1;
  Vec_Str_t *p;
  Abc_Obj_t *pNode;
  int i;
  
  if (pNtk->ntkFunc == ABC_FUNC_SOP) {
    vCubes = (Vec_Ptr_t *)malloc(0x10);
    vCubes->nCap = 1000;
    vCubes->nSize = 0;
    ppvVar1 = (void **)malloc(8000);
    vCubes->pArray = ppvVar1;
    p = Vec_StrAlloc(1000);
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pNode = Abc_NtkObj(pNtk,i);
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NodeSortCubes(pNode,vCubes,p);
      }
    }
    Vec_StrFree(p);
    free(vCubes->pArray);
    free(vCubes);
    return;
  }
  __assert_fail("Abc_NtkHasSop(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                ,0x148,"void Abc_NtkSortCubes(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkSortCubes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vCubes;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkHasSop(pNtk) );
    vCubes = Vec_PtrAlloc( 1000 );
    vStore = Vec_StrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Abc_NodeSortCubes( pNode, vCubes, vStore );
    Vec_StrFree( vStore );
    Vec_PtrFree( vCubes );
}